

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrokeTests.cpp
# Opt level: O0

void __thiscall
agge::tests::PathStrokeTests::TwoOutlinesAreGeneratedForPolygons(PathStrokeTests *this)

{
  double dVar1;
  real_t y;
  point pVar2;
  allocator local_1171;
  string local_1170 [32];
  LocationInfo local_1150;
  undefined8 local_1128;
  real_t local_1120;
  undefined8 local_1118;
  real_t local_1110;
  undefined8 local_1108;
  real_t local_1100;
  undefined8 local_10f8;
  real_t local_10f0;
  undefined8 local_10e8;
  real_t local_10e0;
  undefined8 local_10d8;
  real_t local_10d0;
  undefined8 local_10c8;
  real_t local_10c0;
  undefined8 local_10b8;
  real_t local_10b0;
  undefined8 local_10a8;
  real_t local_10a0;
  undefined8 local_1098;
  real_t local_1090;
  undefined8 local_1088;
  real_t local_1080;
  undefined8 local_1078;
  real_t local_1070;
  undefined8 local_1068;
  real_t local_1060;
  undefined8 local_1058;
  real_t local_1050;
  undefined8 local_1048;
  real_t local_1040;
  undefined8 local_1038;
  real_t local_1030;
  undefined8 local_1028;
  real_t local_1020;
  undefined8 local_1018;
  real_t local_1010;
  undefined8 local_1008;
  real_t local_1000;
  undefined8 local_ff8;
  real_t local_ff0;
  undefined8 local_fe8;
  real_t local_fe0;
  undefined8 local_fd8;
  real_t local_fd0;
  undefined8 local_fc8;
  real_t local_fc0;
  undefined8 local_fb8;
  real_t local_fb0;
  undefined8 local_fa8;
  real_t local_fa0;
  undefined8 local_f98;
  real_t local_f90;
  undefined8 local_f88;
  real_t local_f80;
  undefined8 local_f78;
  real_t local_f70;
  undefined8 local_f68;
  real_t local_f60;
  undefined8 local_f58;
  real_t local_f50;
  undefined8 local_f48;
  real_t local_f40;
  undefined8 local_f38;
  real_t local_f30;
  undefined8 local_f28;
  real_t local_f20;
  undefined8 local_f18;
  real_t local_f10;
  undefined8 local_f08;
  real_t local_f00;
  undefined8 local_ef8;
  real_t local_ef0;
  undefined8 local_ee8;
  real_t local_ee0;
  undefined8 local_ed8;
  real_t local_ed0;
  undefined8 local_ec8;
  real_t local_ec0;
  point local_eb8;
  undefined1 local_ea8 [8];
  point reference2 [43];
  real_t l;
  undefined1 local_9e8 [8];
  point points2 [43];
  LocationInfo local_7c0;
  undefined8 local_798;
  real_t local_790;
  undefined8 local_788;
  real_t local_780;
  undefined8 local_778;
  real_t local_770;
  undefined8 local_768;
  real_t local_760;
  undefined8 local_758;
  real_t local_750;
  undefined8 local_748;
  real_t local_740;
  undefined8 local_738;
  real_t local_730;
  undefined8 local_728;
  real_t local_720;
  undefined8 local_718;
  real_t local_710;
  undefined8 local_708;
  real_t local_700;
  undefined8 local_6f8;
  real_t local_6f0;
  undefined8 local_6e8;
  real_t local_6e0;
  undefined8 local_6d8;
  real_t local_6d0;
  undefined8 local_6c8;
  real_t local_6c0;
  undefined8 local_6b8;
  real_t local_6b0;
  undefined8 local_6a8;
  real_t local_6a0;
  undefined8 local_698;
  real_t local_690;
  undefined8 local_688;
  real_t local_680;
  undefined8 local_678;
  real_t local_670;
  undefined8 local_668;
  real_t local_660;
  undefined8 local_658;
  real_t local_650;
  undefined8 local_648;
  real_t local_640;
  undefined8 local_638;
  real_t local_630;
  undefined8 local_628;
  real_t local_620;
  undefined8 local_618;
  real_t local_610;
  undefined8 local_608;
  real_t local_600;
  undefined8 local_5f8;
  real_t local_5f0;
  undefined8 local_5e8;
  real_t local_5e0;
  undefined8 local_5d8;
  real_t local_5d0;
  point local_5c8;
  undefined1 local_5b8 [8];
  point reference1 [33];
  undefined1 local_218 [8];
  point points1 [33];
  undefined1 local_68 [8];
  stroke s;
  PathStrokeTests *this_local;
  
  s._80_8_ = this;
  stroke::stroke((stroke *)local_68);
  move_to<agge::stroke>((stroke *)local_68,1.0,1.0);
  line_to<agge::stroke>((stroke *)local_68,4.0,5.0,false);
  line_to<agge::stroke>((stroke *)local_68,4.0,15.0,false);
  end_poly<agge::stroke>((stroke *)local_68,true);
  anon_unknown_1::passthrough_join::passthrough_join
            ((passthrough_join *)&points1[0x20].command,&this->amount_alive);
  stroke::set_join<agge::tests::(anonymous_namespace)::passthrough_join>
            ((stroke *)local_68,(passthrough_join *)&points1[0x20].command);
  anon_unknown_1::passthrough_join::~passthrough_join((passthrough_join *)&points1[0x20].command);
  stroke::width((stroke *)local_68,2.0);
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0].x = (real_t)pVar2.command;
  local_218 = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[1].x = (real_t)pVar2.command;
  points1[0]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[2].x = (real_t)pVar2.command;
  points1[1]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[3].x = (real_t)pVar2.command;
  points1[2]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[4].x = (real_t)pVar2.command;
  points1[3]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[5].x = (real_t)pVar2.command;
  points1[4]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[6].x = (real_t)pVar2.command;
  points1[5]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[7].x = (real_t)pVar2.command;
  points1[6]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[8].x = (real_t)pVar2.command;
  points1[7]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[9].x = (real_t)pVar2.command;
  points1[8]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[10].x = (real_t)pVar2.command;
  points1[9]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0xb].x = (real_t)pVar2.command;
  points1[10]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0xc].x = (real_t)pVar2.command;
  points1[0xb]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0xd].x = (real_t)pVar2.command;
  points1[0xc]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0xe].x = (real_t)pVar2.command;
  points1[0xd]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0xf].x = (real_t)pVar2.command;
  points1[0xe]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x10].x = (real_t)pVar2.command;
  points1[0xf]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x11].x = (real_t)pVar2.command;
  points1[0x10]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x12].x = (real_t)pVar2.command;
  points1[0x11]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x13].x = (real_t)pVar2.command;
  points1[0x12]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x14].x = (real_t)pVar2.command;
  points1[0x13]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x15].x = (real_t)pVar2.command;
  points1[0x14]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x16].x = (real_t)pVar2.command;
  points1[0x15]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x17].x = (real_t)pVar2.command;
  points1[0x16]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x18].x = (real_t)pVar2.command;
  points1[0x17]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x19].x = (real_t)pVar2.command;
  points1[0x18]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x1a].x = (real_t)pVar2.command;
  points1[0x19]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x1b].x = (real_t)pVar2.command;
  points1[0x1a]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x1c].x = (real_t)pVar2.command;
  points1[0x1b]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x1d].x = (real_t)pVar2.command;
  points1[0x1c]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x1e].x = (real_t)pVar2.command;
  points1[0x1d]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x1f].x = (real_t)pVar2.command;
  points1[0x1e]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points1[0x20].x = (real_t)pVar2.command;
  unique0x10000e7d = pVar2._0_8_;
  points1[0x1f]._4_8_ = unique0x10000e7d;
  dVar1 = sqrt(5.57859275551463e-315);
  pVar2 = moveto(1.0,SUB84(dVar1,0));
  local_5c8.command = pVar2.command;
  local_5c8._0_8_ = pVar2._0_8_;
  local_5b8 = (undefined1  [8])local_5c8._0_8_;
  reference1[0].x = (real_t)local_5c8.command;
  pVar2 = lineto(4.0,15.0);
  local_5d0 = (real_t)pVar2.command;
  local_5d8 = pVar2._0_8_;
  reference1[0]._4_8_ = local_5d8;
  reference1[1].x = local_5d0;
  pVar2 = lineto(1.0,1.0);
  local_5e0 = (real_t)pVar2.command;
  local_5e8 = pVar2._0_8_;
  reference1[1]._4_8_ = local_5e8;
  reference1[2].x = local_5e0;
  pVar2 = lineto(4.0,5.0);
  local_5f0 = (real_t)pVar2.command;
  local_5f8 = pVar2._0_8_;
  reference1[2]._4_8_ = local_5f8;
  reference1[3].x = local_5f0;
  pVar2 = lineto(5.0,0.0);
  local_600 = (real_t)pVar2.command;
  local_608 = pVar2._0_8_;
  reference1[3]._4_8_ = local_608;
  reference1[4].x = local_600;
  pVar2 = lineto(1.0,5.0);
  local_610 = (real_t)pVar2.command;
  local_618 = pVar2._0_8_;
  reference1[4]._4_8_ = local_618;
  reference1[5].x = local_610;
  pVar2 = lineto(1.0,1.0);
  local_620 = (real_t)pVar2.command;
  local_628 = pVar2._0_8_;
  reference1[5]._4_8_ = local_628;
  reference1[6].x = local_620;
  pVar2 = lineto(4.0,5.0);
  local_630 = (real_t)pVar2.command;
  local_638 = pVar2._0_8_;
  reference1[6]._4_8_ = local_638;
  reference1[7].x = local_630;
  pVar2 = lineto(4.0,15.0);
  local_640 = (real_t)pVar2.command;
  local_648 = pVar2._0_8_;
  reference1[7]._4_8_ = local_648;
  reference1[8].x = local_640;
  pVar2 = lineto(10.0,0.0);
  local_650 = (real_t)pVar2.command;
  local_658 = pVar2._0_8_;
  reference1[8]._4_8_ = local_658;
  reference1[9].x = local_650;
  pVar2 = lineto(1.0,10.0);
  local_660 = (real_t)pVar2.command;
  local_668 = pVar2._0_8_;
  reference1[9]._4_8_ = local_668;
  reference1[10].x = local_660;
  pVar2 = lineto(4.0,5.0);
  local_670 = (real_t)pVar2.command;
  local_678 = pVar2._0_8_;
  reference1[10]._4_8_ = local_678;
  reference1[0xb].x = local_670;
  pVar2 = lineto(4.0,15.0);
  local_680 = (real_t)pVar2.command;
  local_688 = pVar2._0_8_;
  reference1[0xb]._4_8_ = local_688;
  reference1[0xc].x = local_680;
  pVar2 = lineto(1.0,1.0);
  local_690 = (real_t)pVar2.command;
  local_698 = pVar2._0_8_;
  reference1[0xc]._4_8_ = local_698;
  reference1[0xd].x = local_690;
  dVar1 = sqrt(5.57859275551463e-315);
  pVar2 = lineto(SUB84(dVar1,0),0.0);
  local_6a0 = (real_t)pVar2.command;
  local_6a8 = pVar2._0_8_;
  reference1[0xe].y = 0.0;
  reference1[0xe].command = 0;
  reference1[0xf].x = 6.72623e-44;
  reference1[0xd]._4_8_ = local_6a8;
  reference1[0xe].x = local_6a0;
  pVar2 = moveto(1.0,5.0);
  local_6b0 = (real_t)pVar2.command;
  local_6b8 = pVar2._0_8_;
  reference1[0xf]._4_8_ = local_6b8;
  reference1[0x10].x = local_6b0;
  pVar2 = lineto(4.0,5.0);
  local_6c0 = (real_t)pVar2.command;
  local_6c8 = pVar2._0_8_;
  reference1[0x10]._4_8_ = local_6c8;
  reference1[0x11].x = local_6c0;
  pVar2 = lineto(1.0,1.0);
  local_6d0 = (real_t)pVar2.command;
  local_6d8 = pVar2._0_8_;
  reference1[0x11]._4_8_ = local_6d8;
  reference1[0x12].x = local_6d0;
  pVar2 = lineto(4.0,15.0);
  local_6e0 = (real_t)pVar2.command;
  local_6e8 = pVar2._0_8_;
  reference1[0x12]._4_8_ = local_6e8;
  reference1[0x13].x = local_6e0;
  dVar1 = sqrt(5.57859275551463e-315);
  pVar2 = lineto(SUB84(dVar1,0),0.0);
  local_6f0 = (real_t)pVar2.command;
  local_6f8 = pVar2._0_8_;
  reference1[0x13]._4_8_ = local_6f8;
  reference1[0x14].x = local_6f0;
  dVar1 = sqrt(5.57859275551463e-315);
  pVar2 = lineto(1.0,SUB84(dVar1,0));
  local_700 = (real_t)pVar2.command;
  local_708 = pVar2._0_8_;
  reference1[0x14]._4_8_ = local_708;
  reference1[0x15].x = local_700;
  pVar2 = lineto(1.0,1.0);
  local_710 = (real_t)pVar2.command;
  local_718 = pVar2._0_8_;
  reference1[0x15]._4_8_ = local_718;
  reference1[0x16].x = local_710;
  pVar2 = lineto(4.0,15.0);
  local_720 = (real_t)pVar2.command;
  local_728 = pVar2._0_8_;
  reference1[0x16]._4_8_ = local_728;
  reference1[0x17].x = local_720;
  pVar2 = lineto(4.0,5.0);
  local_730 = (real_t)pVar2.command;
  local_738 = pVar2._0_8_;
  reference1[0x17]._4_8_ = local_738;
  reference1[0x18].x = local_730;
  pVar2 = lineto(10.0,0.0);
  local_740 = (real_t)pVar2.command;
  local_748 = pVar2._0_8_;
  reference1[0x18]._4_8_ = local_748;
  reference1[0x19].x = local_740;
  pVar2 = lineto(1.0,10.0);
  local_750 = (real_t)pVar2.command;
  local_758 = pVar2._0_8_;
  reference1[0x19]._4_8_ = local_758;
  reference1[0x1a].x = local_750;
  pVar2 = lineto(4.0,15.0);
  local_760 = (real_t)pVar2.command;
  local_768 = pVar2._0_8_;
  reference1[0x1a]._4_8_ = local_768;
  reference1[0x1b].x = local_760;
  pVar2 = lineto(4.0,5.0);
  local_770 = (real_t)pVar2.command;
  local_778 = pVar2._0_8_;
  reference1[0x1b]._4_8_ = local_778;
  reference1[0x1c].x = local_770;
  pVar2 = lineto(1.0,1.0);
  local_780 = (real_t)pVar2.command;
  local_788 = pVar2._0_8_;
  reference1[0x1c]._4_8_ = local_788;
  reference1[0x1d].x = local_780;
  pVar2 = lineto(5.0,0.0);
  local_790 = (real_t)pVar2.command;
  local_798 = pVar2._0_8_;
  reference1[0x1e].y = 0.0;
  reference1[0x1e].command = 0;
  reference1[0x1f].x = 6.72623e-44;
  reference1[0x1f].y = 0.0;
  reference1[0x1f].command = 0;
  reference1[0x20].x = 0.0;
  reference1[0x1d]._4_8_ = local_798;
  reference1[0x1e].x = local_790;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&points2[0x2a].command,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,(allocator *)((long)&points2[0x2a].y + 3));
  ut::LocationInfo::LocationInfo(&local_7c0,(string *)&points2[0x2a].command,0x175);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,33ul>
            ((point (*) [33])local_5b8,(point (*) [33])local_218,&local_7c0);
  ut::LocationInfo::~LocationInfo(&local_7c0);
  std::__cxx11::string::~string((string *)&points2[0x2a].command);
  std::allocator<char>::~allocator((allocator<char> *)((long)&points2[0x2a].y + 3));
  stroke::remove_all((stroke *)local_68);
  move_to<agge::stroke>((stroke *)local_68,1.0,1.0);
  line_to<agge::stroke>((stroke *)local_68,5.0,2.0,false);
  line_to<agge::stroke>((stroke *)local_68,4.0,6.0,false);
  line_to<agge::stroke>((stroke *)local_68,0.0,5.0,false);
  end_poly<agge::stroke>((stroke *)local_68,true);
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0].x = (real_t)pVar2.command;
  local_9e8 = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[1].x = (real_t)pVar2.command;
  points2[0]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[2].x = (real_t)pVar2.command;
  points2[1]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[3].x = (real_t)pVar2.command;
  points2[2]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[4].x = (real_t)pVar2.command;
  points2[3]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[5].x = (real_t)pVar2.command;
  points2[4]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[6].x = (real_t)pVar2.command;
  points2[5]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[7].x = (real_t)pVar2.command;
  points2[6]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[8].x = (real_t)pVar2.command;
  points2[7]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[9].x = (real_t)pVar2.command;
  points2[8]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[10].x = (real_t)pVar2.command;
  points2[9]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0xb].x = (real_t)pVar2.command;
  points2[10]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0xc].x = (real_t)pVar2.command;
  points2[0xb]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0xd].x = (real_t)pVar2.command;
  points2[0xc]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0xe].x = (real_t)pVar2.command;
  points2[0xd]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0xf].x = (real_t)pVar2.command;
  points2[0xe]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x10].x = (real_t)pVar2.command;
  points2[0xf]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x11].x = (real_t)pVar2.command;
  points2[0x10]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x12].x = (real_t)pVar2.command;
  points2[0x11]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x13].x = (real_t)pVar2.command;
  points2[0x12]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x14].x = (real_t)pVar2.command;
  points2[0x13]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x15].x = (real_t)pVar2.command;
  points2[0x14]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x16].x = (real_t)pVar2.command;
  points2[0x15]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x17].x = (real_t)pVar2.command;
  points2[0x16]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x18].x = (real_t)pVar2.command;
  points2[0x17]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x19].x = (real_t)pVar2.command;
  points2[0x18]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x1a].x = (real_t)pVar2.command;
  points2[0x19]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x1b].x = (real_t)pVar2.command;
  points2[0x1a]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x1c].x = (real_t)pVar2.command;
  points2[0x1b]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x1d].x = (real_t)pVar2.command;
  points2[0x1c]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x1e].x = (real_t)pVar2.command;
  points2[0x1d]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x1f].x = (real_t)pVar2.command;
  points2[0x1e]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x20].x = (real_t)pVar2.command;
  points2[0x1f]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x21].x = (real_t)pVar2.command;
  points2[0x20]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x22].x = (real_t)pVar2.command;
  points2[0x21]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x23].x = (real_t)pVar2.command;
  points2[0x22]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x24].x = (real_t)pVar2.command;
  points2[0x23]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x25].x = (real_t)pVar2.command;
  points2[0x24]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x26].x = (real_t)pVar2.command;
  points2[0x25]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x27].x = (real_t)pVar2.command;
  points2[0x26]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x28].x = (real_t)pVar2.command;
  points2[0x27]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x29].x = (real_t)pVar2.command;
  points2[0x28]._4_8_ = pVar2._0_8_;
  pVar2 = vertex<agge::stroke>((stroke *)local_68);
  points2[0x2a].x = (real_t)pVar2.command;
  points2[0x29]._4_8_ = pVar2._0_8_;
  dVar1 = sqrt(5.43191549518332e-315);
  y = SUB84(dVar1,0);
  pVar2 = moveto(1.0,y);
  local_eb8.command = pVar2.command;
  local_eb8._0_8_ = pVar2._0_8_;
  local_ea8 = (undefined1  [8])local_eb8._0_8_;
  reference2[0].x = (real_t)local_eb8.command;
  pVar2 = lineto(0.0,5.0);
  local_ec0 = (real_t)pVar2.command;
  local_ec8 = pVar2._0_8_;
  reference2[0]._4_8_ = local_ec8;
  reference2[1].x = local_ec0;
  pVar2 = lineto(1.0,1.0);
  local_ed0 = (real_t)pVar2.command;
  local_ed8 = pVar2._0_8_;
  reference2[1]._4_8_ = local_ed8;
  reference2[2].x = local_ed0;
  pVar2 = lineto(5.0,2.0);
  local_ee0 = (real_t)pVar2.command;
  local_ee8 = pVar2._0_8_;
  reference2[2]._4_8_ = local_ee8;
  reference2[3].x = local_ee0;
  pVar2 = lineto(y,0.0);
  local_ef0 = (real_t)pVar2.command;
  local_ef8 = pVar2._0_8_;
  reference2[3]._4_8_ = local_ef8;
  reference2[4].x = local_ef0;
  pVar2 = lineto(1.0,y);
  local_f00 = (real_t)pVar2.command;
  local_f08 = pVar2._0_8_;
  reference2[4]._4_8_ = local_f08;
  reference2[5].x = local_f00;
  pVar2 = lineto(1.0,1.0);
  local_f10 = (real_t)pVar2.command;
  local_f18 = pVar2._0_8_;
  reference2[5]._4_8_ = local_f18;
  reference2[6].x = local_f10;
  pVar2 = lineto(5.0,2.0);
  local_f20 = (real_t)pVar2.command;
  local_f28 = pVar2._0_8_;
  reference2[6]._4_8_ = local_f28;
  reference2[7].x = local_f20;
  pVar2 = lineto(4.0,6.0);
  local_f30 = (real_t)pVar2.command;
  local_f38 = pVar2._0_8_;
  reference2[7]._4_8_ = local_f38;
  reference2[8].x = local_f30;
  pVar2 = lineto(y,0.0);
  local_f40 = (real_t)pVar2.command;
  local_f48 = pVar2._0_8_;
  reference2[8]._4_8_ = local_f48;
  reference2[9].x = local_f40;
  pVar2 = lineto(1.0,y);
  local_f50 = (real_t)pVar2.command;
  local_f58 = pVar2._0_8_;
  reference2[9]._4_8_ = local_f58;
  reference2[10].x = local_f50;
  pVar2 = lineto(5.0,2.0);
  local_f60 = (real_t)pVar2.command;
  local_f68 = pVar2._0_8_;
  reference2[10]._4_8_ = local_f68;
  reference2[0xb].x = local_f60;
  pVar2 = lineto(4.0,6.0);
  local_f70 = (real_t)pVar2.command;
  local_f78 = pVar2._0_8_;
  reference2[0xb]._4_8_ = local_f78;
  reference2[0xc].x = local_f70;
  pVar2 = lineto(0.0,5.0);
  local_f80 = (real_t)pVar2.command;
  local_f88 = pVar2._0_8_;
  reference2[0xc]._4_8_ = local_f88;
  reference2[0xd].x = local_f80;
  pVar2 = lineto(y,0.0);
  local_f90 = (real_t)pVar2.command;
  local_f98 = pVar2._0_8_;
  reference2[0xd]._4_8_ = local_f98;
  reference2[0xe].x = local_f90;
  pVar2 = lineto(1.0,y);
  local_fa0 = (real_t)pVar2.command;
  local_fa8 = pVar2._0_8_;
  reference2[0xe]._4_8_ = local_fa8;
  reference2[0xf].x = local_fa0;
  pVar2 = lineto(4.0,6.0);
  local_fb0 = (real_t)pVar2.command;
  local_fb8 = pVar2._0_8_;
  reference2[0xf]._4_8_ = local_fb8;
  reference2[0x10].x = local_fb0;
  pVar2 = lineto(0.0,5.0);
  local_fc0 = (real_t)pVar2.command;
  local_fc8 = pVar2._0_8_;
  reference2[0x10]._4_8_ = local_fc8;
  reference2[0x11].x = local_fc0;
  pVar2 = lineto(1.0,1.0);
  local_fd0 = (real_t)pVar2.command;
  local_fd8 = pVar2._0_8_;
  reference2[0x11]._4_8_ = local_fd8;
  reference2[0x12].x = local_fd0;
  pVar2 = lineto(y,0.0);
  local_fe0 = (real_t)pVar2.command;
  local_fe8 = pVar2._0_8_;
  reference2[0x13].y = 0.0;
  reference2[0x13].command = 0;
  reference2[0x14].x = 6.72623e-44;
  reference2[0x12]._4_8_ = local_fe8;
  reference2[0x13].x = local_fe0;
  pVar2 = moveto(1.0,y);
  local_ff0 = (real_t)pVar2.command;
  local_ff8 = pVar2._0_8_;
  reference2[0x14]._4_8_ = local_ff8;
  reference2[0x15].x = local_ff0;
  pVar2 = lineto(5.0,2.0);
  local_1000 = (real_t)pVar2.command;
  local_1008 = pVar2._0_8_;
  reference2[0x15]._4_8_ = local_1008;
  reference2[0x16].x = local_1000;
  pVar2 = lineto(1.0,1.0);
  local_1010 = (real_t)pVar2.command;
  local_1018 = pVar2._0_8_;
  reference2[0x16]._4_8_ = local_1018;
  reference2[0x17].x = local_1010;
  pVar2 = lineto(0.0,5.0);
  local_1020 = (real_t)pVar2.command;
  local_1028 = pVar2._0_8_;
  reference2[0x17]._4_8_ = local_1028;
  reference2[0x18].x = local_1020;
  pVar2 = lineto(y,0.0);
  local_1030 = (real_t)pVar2.command;
  local_1038 = pVar2._0_8_;
  reference2[0x18]._4_8_ = local_1038;
  reference2[0x19].x = local_1030;
  pVar2 = lineto(1.0,y);
  local_1040 = (real_t)pVar2.command;
  local_1048 = pVar2._0_8_;
  reference2[0x19]._4_8_ = local_1048;
  reference2[0x1a].x = local_1040;
  pVar2 = lineto(1.0,1.0);
  local_1050 = (real_t)pVar2.command;
  local_1058 = pVar2._0_8_;
  reference2[0x1a]._4_8_ = local_1058;
  reference2[0x1b].x = local_1050;
  pVar2 = lineto(0.0,5.0);
  local_1060 = (real_t)pVar2.command;
  local_1068 = pVar2._0_8_;
  reference2[0x1b]._4_8_ = local_1068;
  reference2[0x1c].x = local_1060;
  pVar2 = lineto(4.0,6.0);
  local_1070 = (real_t)pVar2.command;
  local_1078 = pVar2._0_8_;
  reference2[0x1c]._4_8_ = local_1078;
  reference2[0x1d].x = local_1070;
  pVar2 = lineto(y,0.0);
  local_1080 = (real_t)pVar2.command;
  local_1088 = pVar2._0_8_;
  reference2[0x1d]._4_8_ = local_1088;
  reference2[0x1e].x = local_1080;
  pVar2 = lineto(1.0,y);
  local_1090 = (real_t)pVar2.command;
  local_1098 = pVar2._0_8_;
  reference2[0x1e]._4_8_ = local_1098;
  reference2[0x1f].x = local_1090;
  pVar2 = lineto(0.0,5.0);
  local_10a0 = (real_t)pVar2.command;
  local_10a8 = pVar2._0_8_;
  reference2[0x1f]._4_8_ = local_10a8;
  reference2[0x20].x = local_10a0;
  pVar2 = lineto(4.0,6.0);
  local_10b0 = (real_t)pVar2.command;
  local_10b8 = pVar2._0_8_;
  reference2[0x20]._4_8_ = local_10b8;
  reference2[0x21].x = local_10b0;
  pVar2 = lineto(5.0,2.0);
  local_10c0 = (real_t)pVar2.command;
  local_10c8 = pVar2._0_8_;
  reference2[0x21]._4_8_ = local_10c8;
  reference2[0x22].x = local_10c0;
  pVar2 = lineto(y,0.0);
  local_10d0 = (real_t)pVar2.command;
  local_10d8 = pVar2._0_8_;
  reference2[0x22]._4_8_ = local_10d8;
  reference2[0x23].x = local_10d0;
  pVar2 = lineto(1.0,y);
  local_10e0 = (real_t)pVar2.command;
  local_10e8 = pVar2._0_8_;
  reference2[0x23]._4_8_ = local_10e8;
  reference2[0x24].x = local_10e0;
  pVar2 = lineto(4.0,6.0);
  local_10f0 = (real_t)pVar2.command;
  local_10f8 = pVar2._0_8_;
  reference2[0x24]._4_8_ = local_10f8;
  reference2[0x25].x = local_10f0;
  pVar2 = lineto(5.0,2.0);
  local_1100 = (real_t)pVar2.command;
  local_1108 = pVar2._0_8_;
  reference2[0x25]._4_8_ = local_1108;
  reference2[0x26].x = local_1100;
  pVar2 = lineto(1.0,1.0);
  local_1110 = (real_t)pVar2.command;
  local_1118 = pVar2._0_8_;
  reference2[0x26]._4_8_ = local_1118;
  reference2[0x27].x = local_1110;
  pVar2 = lineto(y,0.0);
  local_1120 = (real_t)pVar2.command;
  local_1128 = pVar2._0_8_;
  reference2[0x28].y = 0.0;
  reference2[0x28].command = 0;
  reference2[0x29].x = 6.72623e-44;
  reference2[0x29].y = 0.0;
  reference2[0x29].command = 0;
  reference2[0x2a].x = 0.0;
  reference2[0x27]._4_8_ = local_1128;
  reference2[0x28].x = local_1120;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1170,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,&local_1171);
  ut::LocationInfo::LocationInfo(&local_1150,(string *)local_1170,0x19e);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,43ul>
            ((point (*) [43])local_ea8,(point (*) [43])local_9e8,&local_1150);
  ut::LocationInfo::~LocationInfo(&local_1150);
  std::__cxx11::string::~string(local_1170);
  std::allocator<char>::~allocator((allocator<char> *)&local_1171);
  stroke::~stroke((stroke *)local_68);
  return;
}

Assistant:

test( TwoOutlinesAreGeneratedForPolygons )
			{
				// INIT
				stroke s;

				move_to(s, 1.0f, 1.0f);
				line_to(s, 4.0f, 5.0f);
				line_to(s, 4.0f, 15.0f);
				end_poly(s, true);

				s.set_join(passthrough_join(amount_alive));
				s.width(2.0f);

				// ACT
				mocks::path::point points1[] = {
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s),
				};

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(1.0f, sqrt(205.0f)), lineto(4.0f, 15.0f), lineto(1.0f, 1.0f), lineto(4.0f, 5.0f), lineto(5.0f, 0.0f),
					lineto(1.0f, 5.0f), lineto(1.0f, 1.0f), lineto(4.0f, 5.0f), lineto(4.0f, 15.0f), lineto(10.0f, 0.0f),
					lineto(1.0f, 10.0f), lineto(4.0f, 5.0f), lineto(4.0f, 15.0f), lineto(1.0f, 1.0f), lineto(sqrt(205.0f), 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					moveto(1.0f, 5.0f), lineto(4.0f, 5.0f), lineto(1.0f, 1.0f), lineto(4.0f, 15.0f), lineto(sqrt(205.0f), 0.0f),
					lineto(1.0f, sqrt(205.0f)), lineto(1.0f, 1.0f), lineto(4.0f, 15.0f), lineto(4.0f, 5.0f), lineto(10.0f, 0.0f),
					lineto(1.0f, 10.0f), lineto(4.0f, 15.0f), lineto(4.0f, 5.0f), lineto(1.0f, 1.0f), lineto(5.0f, 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, points1);

				// INIT
				s.remove_all();

				move_to(s, 1.0f, 1.0f);
				line_to(s, 5.0f, 2.0f);
				line_to(s, 4.0f, 6.0f);
				line_to(s, 0.0f, 5.0f);
				end_poly(s, true);

				// ACT
				mocks::path::point points2[] = {
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s),
				};

				// ASSERT
				real_t l = sqrt(17.0f);
				mocks::path::point reference2[] = {
					moveto(1.0f, l), lineto(0.0f, 5.0f), lineto(1.0f, 1.0f), lineto(5.0f, 2.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(1.0f, 1.0f), lineto(5.0f, 2.0f), lineto(4.0f, 6.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(5.0f, 2.0f), lineto(4.0f, 6.0f), lineto(0.0f, 5.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(4.0f, 6.0f), lineto(0.0f, 5.0f), lineto(1.0f, 1.0f), lineto(l, 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					moveto(1.0f, l), lineto(5.0f, 2.0f), lineto(1.0f, 1.0f), lineto(0.0f, 5.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(1.0f, 1.0f), lineto(0.0f, 5.0f), lineto(4.0f, 6.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(0.0f, 5.0f), lineto(4.0f, 6.0f), lineto(5.0f, 2.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(4.0f, 6.0f), lineto(5.0f, 2.0f), lineto(1.0f, 1.0f), lineto(l, 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, points2);
			}